

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode Curl_smtp_escape_eob(connectdata *conn,ssize_t nread)

{
  SessionHandle *data;
  void *pvVar1;
  size_t __n;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  undefined1 uVar5;
  long lVar6;
  long lVar7;
  
  data = conn->data;
  pvVar1 = (data->req).protop;
  if ((data->state).scratch == (char *)0x0) {
    pcVar2 = (char *)(*Curl_cmalloc)(0x8000);
    (data->state).scratch = pcVar2;
    if (pcVar2 == (char *)0x0) {
      Curl_failf(data,"Failed to alloc scratch buffer!");
      return CURLE_OUT_OF_MEMORY;
    }
  }
  lVar4 = 0;
  lVar7 = 0;
  if (0 < nread) {
    lVar7 = nread;
  }
  lVar6 = 0;
  do {
    __n = *(size_t *)((long)pvVar1 + 0x18);
    if (lVar7 == lVar4) {
      if (__n != 0) {
        memcpy((data->state).scratch + lVar6,"\r\n.\r\n",__n);
        lVar6 = lVar6 + *(long *)((long)pvVar1 + 0x18);
        *(undefined8 *)((long)pvVar1 + 0x18) = 0;
      }
      if (lVar6 != nread) {
        (data->req).upload_fromhere = (data->state).scratch;
        (data->req).upload_present = lVar6;
      }
      return CURLE_OK;
    }
    pcVar2 = (data->req).upload_fromhere;
    if ("\r\n.\r\n"[__n] == pcVar2[lVar4]) {
      uVar3 = __n + 1;
      *(ulong *)((long)pvVar1 + 0x18) = uVar3;
      uVar5 = 1;
      if ((__n != 1) && (__n != 4)) {
LAB_0047b4ec:
        uVar5 = 0;
      }
      *(undefined1 *)((long)pvVar1 + 0x20) = uVar5;
      if (uVar3 == 0) goto LAB_0047b519;
      if (uVar3 == 3) {
        builtin_strncpy((data->state).scratch + lVar6,"\r\n..",4);
        lVar6 = lVar6 + 4;
        *(undefined8 *)((long)pvVar1 + 0x18) = 0;
      }
    }
    else {
      if (__n != 0) {
        memcpy((data->state).scratch + lVar6,"\r\n.\r\n",__n);
        lVar6 = lVar6 + *(long *)((long)pvVar1 + 0x18);
        pcVar2 = (data->req).upload_fromhere;
        uVar3 = (ulong)(pcVar2[lVar4] == '\r');
        *(ulong *)((long)pvVar1 + 0x18) = uVar3;
        goto LAB_0047b4ec;
      }
LAB_0047b519:
      (data->state).scratch[lVar6] = pcVar2[lVar4];
      lVar6 = lVar6 + 1;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_smtp_escape_eob(struct connectdata *conn, ssize_t nread)
{
  /* When sending a SMTP payload we must detect CRLF. sequences making sure
     they are sent as CRLF.. instead, as a . on the beginning of a line will
     be deleted by the server when not part of an EOB terminator and a
     genuine CRLF.CRLF which isn't escaped will wrongly be detected as end of
     data by the server
  */
  ssize_t i;
  ssize_t si;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;

  /* Do we need to allocate the scatch buffer? */
  if(!data->state.scratch) {
    data->state.scratch = malloc(2 * BUFSIZE);

    if(!data->state.scratch) {
      failf (data, "Failed to alloc scratch buffer!");
      return CURLE_OUT_OF_MEMORY;
    }
  }

  /* This loop can be improved by some kind of Boyer-Moore style of
     approach but that is saved for later... */
  for(i = 0, si = 0; i < nread; i++) {
    if(SMTP_EOB[smtp->eob] == data->req.upload_fromhere[i]) {
      smtp->eob++;

      /* Is the EOB potentially the terminating CRLF? */
      if(2 == smtp->eob || SMTP_EOB_LEN == smtp->eob)
        smtp->trailing_crlf = TRUE;
      else
        smtp->trailing_crlf = FALSE;
    }
    else if(smtp->eob) {
      /* A previous substring matched so output that first */
      memcpy(&data->state.scratch[si], SMTP_EOB, smtp->eob);
      si += smtp->eob;

      /* Then compare the first byte */
      if(SMTP_EOB[0] == data->req.upload_fromhere[i])
        smtp->eob = 1;
      else
        smtp->eob = 0;

      /* Reset the trailing CRLF flag as there was more data */
      smtp->trailing_crlf = FALSE;
    }

    /* Do we have a match for CRLF. as per RFC-5321, sect. 4.5.2 */
    if(SMTP_EOB_FIND_LEN == smtp->eob) {
      /* Copy the replacement data to the target buffer */
      memcpy(&data->state.scratch[si], SMTP_EOB_REPL, SMTP_EOB_REPL_LEN);
      si += SMTP_EOB_REPL_LEN;
      smtp->eob = 0;
    }
    else if(!smtp->eob)
      data->state.scratch[si++] = data->req.upload_fromhere[i];
  }

  if(smtp->eob) {
    /* A substring matched before processing ended so output that now */
    memcpy(&data->state.scratch[si], SMTP_EOB, smtp->eob);
    si += smtp->eob;
    smtp->eob = 0;
  }

  if(si != nread) {
    /* Only use the new buffer if we replaced something */
    nread = si;

    /* Upload from the new (replaced) buffer instead */
    data->req.upload_fromhere = data->state.scratch;

    /* Set the new amount too */
    data->req.upload_present = nread;
  }

  return CURLE_OK;
}